

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O1

Var Js::AtomicsObject::ValidateSharedIntegerTypedArray
              (Var typedArray,ScriptContext *scriptContext,bool onlyInt32)

{
  ArrayBufferBase *obj;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  TypedArrayBase *pTVar6;
  int32 hCode;
  Type TVar7;
  
  bVar2 = VarIs<Js::TypedArrayBase>(typedArray);
  if (!bVar2) {
    hCode = -0x7ff5e9e2;
    goto LAB_00b32975;
  }
  if (typedArray == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00b3296b;
    *puVar5 = 0;
  }
  if (((ulong)typedArray & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)typedArray & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b3296b;
    *puVar5 = 0;
  }
  TVar7 = TypeIds_FirstNumberType;
  if ((((ulong)typedArray & 0xffff000000000000) != 0x1000000000000) &&
     (TVar7 = TypeIds_Number, (ulong)typedArray >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(typedArray);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00b3296b;
      *puVar5 = 0;
    }
    TVar7 = ((this->type).ptr)->typeId;
    if (0x57 < (int)TVar7) {
      BVar3 = RecyclableObject::IsExternal(this);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_00b3296b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  if (onlyInt32) {
    if (TVar7 == TypeIds_Int32Array) {
LAB_00b32921:
      pTVar6 = UnsafeVarTo<Js::TypedArrayBase>(typedArray);
      obj = (pTVar6->super_ArrayBufferParent).arrayBuffer.ptr;
      if (obj != (ArrayBufferBase *)0x0) {
        bVar2 = VarIsImpl<Js::ArrayBufferBase>((RecyclableObject *)obj);
        if (bVar2) {
          iVar4 = (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])(obj);
          if ((char)iVar4 != '\0') {
            return obj;
          }
        }
      }
      hCode = -0x7ff5e9e3;
      goto LAB_00b32975;
    }
  }
  else if ((TVar7 - TypeIds_Int16Array < 4) || (TVar7 - TypeIds_Int8Array < 2)) goto LAB_00b32921;
  hCode = -0x7ff5e9e0;
LAB_00b32975:
  JavascriptError::ThrowTypeError(scriptContext,hCode,(PCWSTR)0x0);
}

Assistant:

Var AtomicsObject::ValidateSharedIntegerTypedArray(Var typedArray, ScriptContext *scriptContext, bool onlyInt32)
    {
        if (!VarIs<TypedArrayBase>(typedArray))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedTypedArrayObject);
        }

        TypeId typeId = JavascriptOperators::GetTypeId(typedArray);
        if (onlyInt32)
        {
            if (typeId != TypeIds_Int32Array)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidOperationOnTypedArray);
            }
        }
        else
        {
            if (!(typeId == TypeIds_Int8Array || typeId == TypeIds_Uint8Array || typeId == TypeIds_Int16Array ||
                typeId == TypeIds_Uint16Array || typeId == TypeIds_Int32Array || typeId == TypeIds_Uint32Array))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidOperationOnTypedArray);
            }
        }

        TypedArrayBase *typedArrayBase = UnsafeVarTo<TypedArrayBase>(typedArray);
        ArrayBufferBase* arrayBuffer = typedArrayBase->GetArrayBuffer();
        if (arrayBuffer == nullptr || !VarIsCorrectType(arrayBuffer) || !arrayBuffer->IsSharedArrayBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedSharedArrayBufferObject);
        }

        return arrayBuffer;
    }